

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

Ref<anurbs::NurbsSurfaceGeometry<2L>_> __thiscall
anurbs::Model::get_lazy<anurbs::NurbsSurfaceGeometry<2l>>(Model *this,string *key)

{
  size_type sVar1;
  pointer pcVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> RVar5;
  Pointer<Entry<NurbsSurfaceGeometry<2L>_>_> entry;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> local_78;
  __shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  string local_50;
  
  local_88._0_8_ = (element_type *)0x0;
  local_88._8_8_ = 0;
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&key[1].field_2,in_RDX);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    sVar1 = key->_M_string_length;
    pcVar2 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&local_50,(string *)in_RDX);
    local_78.super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_78.super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Entry<anurbs::NurbsSurfaceGeometry<2L>_>::create
              ((Entry<anurbs::NurbsSurfaceGeometry<2L>_> *)local_98,&local_50,&local_78);
    std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>,(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>,(__gnu_cxx::_Lock_policy)2>
               *)local_88,
              (unique_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
               *)local_98);
    if ((__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
         )local_98._0_8_ !=
        (__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
         )0x0) {
      (*(*(_func_int ***)local_98._0_8_)[4])();
    }
    local_98._0_8_ =
         (__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
          )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.
                super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_50);
    std::static_pointer_cast<anurbs::EntryBase,anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>>
              ((shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> *)local_98);
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,std::allocator<std::shared_ptr<anurbs::EntryBase>>>::
    emplace_back<std::shared_ptr<anurbs::EntryBase>>
              ((vector<std::shared_ptr<anurbs::EntryBase>,std::allocator<std::shared_ptr<anurbs::EntryBase>>>
                *)key,(shared_ptr<anurbs::EntryBase> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)key[1].field_2._M_local_buf,in_RDX);
    pmVar4->first = (long)(sVar1 - (long)pcVar2) >> 4;
    pmVar4->second = 0;
  }
  else {
    std::static_pointer_cast<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>,anurbs::EntryBase>
              ((shared_ptr<anurbs::EntryBase> *)local_98);
    std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)local_88,
                (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  }
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_60,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)local_88);
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)this,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::NurbsSurfaceGeometry<2L>_>)
         RVar5.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ref<TData> get_lazy(std::string key)
    {
        Pointer<Entry<TData>> entry;

        const auto it = m_key_map.find(key);

        if (it == m_key_map.end()) {
            const auto index = m_entries.size();
            entry = Entry<TData>::create(key, nullptr);
            m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));
            m_key_map[key] = { index, 0 };
        } else {
            entry = std::static_pointer_cast<Entry<TData>>(
                m_entries[std::get<0>(it->second)]);
        }

        return Ref<TData>(entry);
    }